

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

bool __thiscall ON_BrepEdge::Read(ON_BrepEdge *this,ON_BinaryArchive *file)

{
  ON_Interval domain_00;
  ON_Interval real_curve_subdomain;
  int iVar1;
  uint uVar2;
  undefined1 local_48 [8];
  ON_Interval domain;
  undefined1 auStack_30 [7];
  bool rc;
  ON_Interval proxy_domain;
  int bReversed;
  ON_BinaryArchive *file_local;
  ON_BrepEdge *this_local;
  
  proxy_domain.m_t[1]._4_4_ = 0;
  ON_Interval::ON_Interval((ON_Interval *)auStack_30);
  domain.m_t[1]._7_1_ = ON_BinaryArchive::ReadInt(file,&this->m_edge_index);
  if ((bool)domain.m_t[1]._7_1_) {
    domain.m_t[1]._7_1_ = ON_BinaryArchive::ReadInt(file,&this->m_c3i);
  }
  if ((bool)domain.m_t[1]._7_1_ != false) {
    domain.m_t[1]._7_1_ =
         ON_BinaryArchive::ReadInt(file,(ON__INT32 *)((long)proxy_domain.m_t + 0xc));
  }
  if ((bool)domain.m_t[1]._7_1_ != false) {
    domain.m_t[1]._7_1_ = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)auStack_30);
  }
  if ((bool)domain.m_t[1]._7_1_ != false) {
    domain.m_t[1]._7_1_ = ON_BinaryArchive::ReadInt(file,2,this->m_vi);
  }
  if ((bool)domain.m_t[1]._7_1_ != false) {
    domain.m_t[1]._7_1_ = ON_BinaryArchive::ReadArray(file,&this->m_ti);
  }
  if ((bool)domain.m_t[1]._7_1_ != false) {
    domain.m_t[1]._7_1_ = ON_BinaryArchive::ReadDouble(file,&this->m_tolerance);
  }
  local_48 = (undefined1  [8])_auStack_30;
  domain.m_t[0] = proxy_domain.m_t[0];
  iVar1 = ON_BinaryArchive::Archive3dmVersion(file);
  if ((((2 < iVar1) && (uVar2 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file), 0xbeee763 < uVar2))
      && ((domain.m_t[1]._7_1_ & 1) != 0)) &&
     (domain.m_t[1]._7_1_ = ON_BinaryArchive::ReadInterval(file,(ON_Interval *)local_48),
     !(bool)domain.m_t[1]._7_1_)) {
    local_48 = (undefined1  [8])_auStack_30;
    domain.m_t[0] = proxy_domain.m_t[0];
  }
  real_curve_subdomain.m_t[1] = proxy_domain.m_t[0];
  real_curve_subdomain.m_t[0] = _auStack_30;
  ON_CurveProxy::SetProxyCurve(&this->super_ON_CurveProxy,(ON_Curve *)0x0,real_curve_subdomain);
  if (proxy_domain.m_t[1]._4_4_ != 0) {
    ON_CurveProxy::Reverse(&this->super_ON_CurveProxy);
  }
  domain_00.m_t[1] = domain.m_t[0];
  domain_00.m_t[0] = (double)local_48;
  ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,domain_00);
  return (bool)(domain.m_t[1]._7_1_ & 1);
}

Assistant:

bool ON_BrepEdge::Read( ON_BinaryArchive& file )
{
  int bReversed = false;
  ON_Interval proxy_domain;
  bool rc = file.ReadInt( &m_edge_index );
  if (rc) rc = file.ReadInt( &m_c3i );
  if (rc) rc = file.ReadInt( &bReversed );
  if (rc) rc = file.ReadInterval( proxy_domain );
  if (rc) rc = file.ReadInt( 2, m_vi );
  if (rc) rc = file.ReadArray( m_ti );
  if (rc) rc = file.ReadDouble( &m_tolerance );
  ON_Interval domain = proxy_domain;
  if (    file.Archive3dmVersion() >= 3 
       && file.ArchiveOpenNURBSVersion() >= 200206180 )
  {
    if (rc) 
    {
      rc = file.ReadInterval(domain);
      if ( !rc)
        domain = proxy_domain;
    }
  }
  SetProxyCurve( nullptr, proxy_domain );
  if ( bReversed )
    ON_CurveProxy::Reverse();
  SetDomain(domain);

  return rc;
}